

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

int __thiscall cmCursesMainForm::LoadCache(cmCursesMainForm *this,char *param_1)

{
  int iVar1;
  
  iVar1 = cmake::LoadCache(this->CMakeInstance);
  if (-1 < iVar1) {
    cmake::SetCacheArgs(this->CMakeInstance,&this->Args);
    cmake::PreLoadCMakeFiles(this->CMakeInstance);
  }
  return iVar1;
}

Assistant:

int cmCursesMainForm::LoadCache(const char* /*unused*/)

{
  int r = this->CMakeInstance->LoadCache();
  if (r < 0) {
    return r;
  }
  this->CMakeInstance->SetCacheArgs(this->Args);
  this->CMakeInstance->PreLoadCMakeFiles();
  return r;
}